

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamWriterPrivate::indent(QXmlStreamWriterPrivate *this,int level)

{
  void *__buf;
  size_t in_RCX;
  int iVar1;
  bool bVar2;
  
  if ((this->field_0x79 & 3) != 0) {
    __buf = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x46f2d8);
    write(this,0x46f2d8,__buf,in_RCX);
  }
  iVar1 = 0;
  if (0 < level) {
    iVar1 = level;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    write(this,(int)(this->autoFormattingIndent)._M_dataplus._M_p,
          (void *)(this->autoFormattingIndent)._M_string_length,in_RCX);
  }
  return;
}

Assistant:

void QXmlStreamWriterPrivate::indent(int level)
{
    if (didWriteStartDocument || didWriteAnyToken)
        write("\n");
    for (int i = 0; i < level; ++i)
        write(autoFormattingIndent);
}